

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saa1099_mame.c
# Opt level: O0

void saa1099m_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  double *pdVar4;
  int local_4c;
  int outlvl;
  saa1099_channel *saach;
  int local_38;
  DEV_SMPL output_r;
  DEV_SMPL output_l;
  INT32 clk2div512;
  UINT32 ch;
  UINT32 j;
  saa1099_state *saa;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *param_local;
  
  if (*(char *)((long)param + 0x16) == '\0') {
    memset(*outputs,0,(ulong)samples << 2);
    memset(outputs[1],0,(ulong)samples << 2);
  }
  else {
    for (output_l = 0; (uint)output_l < 2; output_l = output_l + 1) {
      switch(*(undefined1 *)((long)param + (ulong)(uint)output_l + 8)) {
      case 0:
        *(double *)((long)param + (ulong)(uint)output_l * 0x18 + 0x118) =
             ((double)*(int *)((long)param + 0x148) / 256.0) * 2.0;
        break;
      case 1:
        *(double *)((long)param + (ulong)(uint)output_l * 0x18 + 0x118) =
             ((double)*(int *)((long)param + 0x148) / 512.0) * 2.0;
        break;
      case 2:
        *(double *)((long)param + (ulong)(uint)output_l * 0x18 + 0x118) =
             ((double)*(int *)((long)param + 0x148) / 1024.0) * 2.0;
        break;
      case 3:
        *(undefined8 *)((long)param + (ulong)(uint)output_l * 0x18 + 0x118) =
             *(undefined8 *)((long)param + (ulong)(uint)(output_l * 3) * 0x28 + 0x38);
      }
    }
    iVar1 = (*(int *)((long)param + 0x148) + 0x80) / 0x100;
    for (clk2div512 = 0; (uint)clk2div512 < samples; clk2div512 = clk2div512 + 1) {
      local_38 = 0;
      saach._4_4_ = 0;
      for (output_l = 0; (uint)output_l < 6; output_l = output_l + 1) {
        pbVar3 = (byte *)((long)param + (ulong)(uint)output_l * 0x28 + 0x20);
        if ((*(double *)(pbVar3 + 0x18) == 0.0) && (!NAN(*(double *)(pbVar3 + 0x18)))) {
          *(double *)(pbVar3 + 0x18) =
               (double)(iVar1 << (pbVar3[3] & 0x1f)) / (double)(int)(0x1ff - (uint)*pbVar3);
        }
        *(double *)(pbVar3 + 0x10) = *(double *)(pbVar3 + 0x10) - *(double *)(pbVar3 + 0x18);
        while (*(double *)(pbVar3 + 0x10) <= 0.0 && *(double *)(pbVar3 + 0x10) != 0.0) {
          *(double *)(pbVar3 + 0x18) =
               (double)(iVar1 << (pbVar3[3] & 0x1f)) / (511.0 - (double)*pbVar3);
          *(double *)(pbVar3 + 0x10) = *(double *)((long)param + 0x140) + *(double *)(pbVar3 + 0x10)
          ;
          pbVar3[0x20] = pbVar3[0x20] ^ 1;
          if ((output_l == 1) && (*(char *)((long)param + 0x12) == '\0')) {
            saa1099_envelope_w((saa1099_state *)param,0);
          }
          else if ((output_l == 4) && (*(char *)((long)param + 0x13) == '\0')) {
            saa1099_envelope_w((saa1099_state *)param,1);
          }
        }
        if (pbVar3[0x21] == 0) {
          local_4c = 0;
          if ((pbVar3[2] != 0) &&
             (local_4c = -1,
             (*(uint *)((long)param + ((ulong)(uint)output_l / 3) * 0x18 + 0x120) & 1) != 0)) {
            local_4c = 1;
          }
          if (pbVar3[1] != 0) {
            iVar2 = -1;
            if ((pbVar3[0x20] & 1) != 0) {
              iVar2 = 1;
            }
            local_4c = iVar2 + local_4c;
          }
          local_38 = (int)(local_4c * *(int *)(pbVar3 + 4) * (uint)pbVar3[0xc]) / 0x20 + local_38;
          saach._4_4_ = (int)(local_4c * *(int *)(pbVar3 + 8) * (uint)pbVar3[0xd]) / 0x20 +
                        saach._4_4_;
        }
      }
      for (output_l = 0; (uint)output_l < 2; output_l = output_l + 1) {
        pdVar4 = (double *)((long)param + (ulong)(uint)output_l * 0x18 + 0x110);
        *pdVar4 = *pdVar4 - *(double *)((long)param + (ulong)(uint)output_l * 0x18 + 0x118);
        while (pdVar4 = (double *)((long)param + (ulong)(uint)output_l * 0x18 + 0x110),
              *pdVar4 <= 0.0 && *pdVar4 != 0.0) {
          pdVar4 = (double *)((long)param + (ulong)(uint)output_l * 0x18 + 0x110);
          *pdVar4 = *(double *)((long)param + 0x140) + *pdVar4;
          if (((*(uint *)((long)param + (ulong)(uint)output_l * 0x18 + 0x120) & 0x20000) == 0) ==
              ((*(uint *)((long)param + (ulong)(uint)output_l * 0x18 + 0x120) & 0x400) == 0)) {
            *(int *)((long)param + (ulong)(uint)output_l * 0x18 + 0x120) =
                 *(int *)((long)param + (ulong)(uint)output_l * 0x18 + 0x120) << 1;
          }
          else {
            *(uint *)((long)param + (ulong)(uint)output_l * 0x18 + 0x120) =
                 *(int *)((long)param + (ulong)(uint)output_l * 0x18 + 0x120) << 1 | 1;
          }
        }
      }
      (*outputs)[(uint)clk2div512] = local_38 / 6;
      outputs[1][(uint)clk2div512] = saach._4_4_ / 6;
    }
  }
  return;
}

Assistant:

static void saa1099m_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	saa1099_state *saa = (saa1099_state *)param;
	UINT32 j, ch;
	INT32 clk2div512;

	/* if the channels are disabled we're done */
	if (!saa->all_ch_enable)
	{
		/* init output data */
		memset(outputs[LEFT],0,samples*sizeof(*outputs[LEFT]));
		memset(outputs[RIGHT],0,samples*sizeof(*outputs[RIGHT]));
		return;
	}

	for (ch = 0; ch < 2; ch++)
	{
		switch (saa->noise_params[ch])
		{
		case 0: saa->noise[ch].freq = saa->master_clock/ 256.0 * 2; break;
		case 1: saa->noise[ch].freq = saa->master_clock/ 512.0 * 2; break;
		case 2: saa->noise[ch].freq = saa->master_clock/1024.0 * 2; break;
		case 3: saa->noise[ch].freq = saa->channels[ch * 3].freq;   break; // todo: this case will be m_master_clock/[ch*3's octave divisor, 0 is = 256*2, higher numbers are higher] * 2 if the tone generator phase reset bit (0x1c bit 1) is set.
		}
	}

	// clock fix thanks to http://www.vogons.org/viewtopic.php?p=344227#p344227
	//clk2div512 = 2 * saa->master_clock / 512;
	clk2div512 = (saa->master_clock + 128) / 256;
	
	/* fill all data needed */
	for( j = 0; j < samples; j++ )
	{
		DEV_SMPL output_l = 0, output_r = 0;

		/* for each channel */
		for (ch = 0; ch < 6; ch++)
		{
			struct saa1099_channel* saach = &saa->channels[ch];
			int outlvl;

			if (saach->freq == 0.0)
				saach->freq = (double)(clk2div512 << saach->octave) /
					(double)(511 - saach->frequency);

			/* check the actual position in the square wave */
			saach->counter -= saach->freq;
			while (saach->counter < 0)
			{
				/* calculate new frequency now after the half wave is updated */
				saach->freq = (double)(clk2div512 << saach->octave) /
					(double)(511.0 - saach->frequency);

				saach->counter += saa->sample_rate;
				saach->level ^= 1;

				/* eventually clock the envelope counters */
				if (ch == 1 && saa->env_clock[0] == 0)
					saa1099_envelope_w(saa, 0);
				else if (ch == 4 && saa->env_clock[1] == 0)
					saa1099_envelope_w(saa, 1);
			}

			if (saach->Muted)
				continue;	// placed here to ensure that envelopes are updated
			
#if 0
			// if the noise is enabled
			if (saach->noise_enable)
			{
				// if the noise level is high (noise 0: chan 0-2, noise 1: chan 3-5)
				if (saa->noise[ch/3].level & 1)
				{
					// subtract to avoid overflows, also use only half amplitude
					output_l -= saach->amplitude[ LEFT] * saach->envelope[ LEFT] / 16;
					output_r -= saach->amplitude[RIGHT] * saach->envelope[RIGHT] / 16;
				}
			}
			// if the square wave is enabled
			if (saach->freq_enable)
			{
				// if the channel level is high
				if (saach->level & 1)
				{
					output_l += saach->amplitude[ LEFT] * saach->envelope[ LEFT] / 16;
					output_r += saach->amplitude[RIGHT] * saach->envelope[RIGHT] / 16;
				}
			}
#else
			// Now with bipolar output. -Valley Bell
			outlvl = 0;
			if (saach->noise_enable)
				outlvl += (saa->noise[ch/3].level & 1) ? +1 : -1;
			if (saach->freq_enable)
				outlvl += (saach->level & 1) ? +1 : -1;
			output_l += outlvl * saach->amplitude[ LEFT] * saach->envelope[ LEFT] / 32;
			output_r += outlvl * saach->amplitude[RIGHT] * saach->envelope[RIGHT] / 32;
#endif
		}

		for (ch = 0; ch < 2; ch++)
		{
			/* update the state of the noise generator
			 * polynomial is x^18 + x^11 + x (i.e. 0x20400) and is a plain XOR, initial state is probably all 1s
			 * see http://www.vogons.org/viewtopic.php?f=9&t=51695 */
			saa->noise[ch].counter -= saa->noise[ch].freq;
			while (saa->noise[ch].counter < 0)
			{
				saa->noise[ch].counter += saa->sample_rate;
				if( ((saa->noise[ch].level & 0x20000) == 0) != ((saa->noise[ch].level & 0x0400) == 0) )
					saa->noise[ch].level = (saa->noise[ch].level << 1) | 1;
				else
					saa->noise[ch].level <<= 1;
			}
		}
		/* write sound data to the buffer */
		outputs[LEFT][j] = output_l / 6;
		outputs[RIGHT][j] = output_r / 6;
	}
}